

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDateTime __thiscall QDate::startOfDay(QDate *this,QTimeZone *zone)

{
  QDate date;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  TimeSpec TVar5;
  QDate QVar6;
  Data in_RDI;
  long in_FS_OFFSET;
  QDate in_stack_00000028;
  QDateTime *at;
  QDateTime when;
  OffsetData tran;
  int in_stack_fffffffffffffec8;
  TransitionResolution in_stack_fffffffffffffecc;
  OffsetData *in_stack_fffffffffffffed0;
  QDateTime *in_stack_fffffffffffffed8;
  DaySide in_stack_fffffffffffffee4;
  qint64 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  QTime QVar7;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  QDate in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 uVar8;
  Data *beforeDateTime;
  undefined7 in_stack_ffffffffffffff18;
  QTimeZone *in_stack_ffffffffffffff80;
  Data local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  QVar7.mds = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = inDateTimeRange(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
  if ((!bVar1) || (bVar1 = QTimeZone::isValid((QTimeZone *)in_stack_fffffffffffffed8), !bVar1)) {
    QDateTime::QDateTime((QDateTime *)0x5663f9);
    goto LAB_005667cf;
  }
  local_40.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTime::QTime((QTime *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
               in_stack_fffffffffffffec8,0,0x566439);
  beforeDateTime = &local_40;
  QVar6.jd._7_1_ = in_stack_fffffffffffffeff;
  QVar6.jd._0_7_ = in_stack_fffffffffffffef8;
  QDateTime::QDateTime
            (in_stack_fffffffffffffed8,QVar6,QVar7,(QTimeZone *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffecc);
  uVar2 = QDateTime::isValid((QDateTime *)in_stack_fffffffffffffed0);
  uVar8 = true;
  if ((bool)uVar2) {
    in_stack_ffffffffffffff00 = QDateTime::date(in_stack_fffffffffffffed8);
    uVar8 = ::operator!=((QDate *)in_stack_fffffffffffffed0,
                         (QDate *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  if ((bool)uVar8 == false) {
LAB_00566797:
    QDateTime::QDateTime
              ((QDateTime *)in_stack_fffffffffffffed0,
               (QDateTime *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  else {
    TVar5 = QTimeZone::timeSpec((QTimeZone *)in_stack_fffffffffffffed0);
    if ((TVar5 != TimeZone) ||
       (uVar3 = QTimeZone::hasTransitions
                          ((QTimeZone *)
                           CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)),
       !(bool)uVar3)) {
LAB_00566746:
      toEarliest(in_stack_00000028,in_stack_ffffffffffffff80);
      QDateTime::operator=
                ((QDateTime *)in_stack_fffffffffffffed0,
                 (QDateTime *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      QDateTime::~QDateTime((QDateTime *)0x566797);
      goto LAB_00566797;
    }
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QVar6 = addDays((QDate *)in_stack_fffffffffffffed8,(qint64)in_stack_fffffffffffffed0);
    QVar7.mds = (int)((ulong)QVar6.jd >> 0x20);
    QTime::QTime((QTime *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                 in_stack_fffffffffffffec8,0,0x566571);
    date.jd._7_1_ = uVar3;
    date.jd._0_7_ = in_stack_fffffffffffffef8;
    QDateTime::QDateTime
              (in_stack_fffffffffffffed8,date,QVar7,(QTimeZone *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffecc);
    QTimeZone::previousTransition
              ((QTimeZone *)CONCAT17(uVar2,in_stack_ffffffffffffff18),
               (QDateTime *)&beforeDateTime->data);
    QDateTime::~QDateTime((QDateTime *)0x5665c8);
    QDateTime::toTimeZone
              ((QDateTime *)CONCAT17(uVar8,in_stack_ffffffffffffff08),
               (QTimeZone *)in_stack_ffffffffffffff00.jd);
    bVar1 = QDateTime::isValid((QDateTime *)in_stack_fffffffffffffed0);
    bVar4 = false;
    if (bVar1) {
      QDateTime::date(in_stack_fffffffffffffed8);
      bVar4 = ::operator==((QDate *)in_stack_fffffffffffffed0,
                           (QDate *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
    if (bVar4 != false) {
      QDateTime::QDateTime
                ((QDateTime *)in_stack_fffffffffffffed0,
                 (QDateTime *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
    QDateTime::~QDateTime((QDateTime *)0x56671e);
    QTimeZone::OffsetData::~OffsetData(in_stack_fffffffffffffed0);
    if (bVar4 == false) goto LAB_00566746;
  }
  QDateTime::~QDateTime((QDateTime *)0x5667be);
LAB_005667cf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDateTime)in_RDI;
}

Assistant:

QDateTime QDate::startOfDay(const QTimeZone &zone) const
{
    if (!inDateTimeRange(jd, DaySide::Start) || !zone.isValid())
        return QDateTime();

    QDateTime when(*this, QTime(0, 0), zone,
                   QDateTime::TransitionResolution::RelativeToBefore);
    if (Q_UNLIKELY(!when.isValid() || when.date() != *this)) {
#if QT_CONFIG(timezone)
        // The start of the day must have fallen in a spring-forward's gap; find the spring-forward:
        if (zone.timeSpec() == Qt::TimeZone && zone.hasTransitions()) {
            QTimeZone::OffsetData tran
                // There's unlikely to be another transition before noon tomorrow.
                // However, the whole of today may have been skipped !
                = zone.previousTransition(QDateTime(addDays(1), QTime(12, 0), zone));
            const QDateTime &at = tran.atUtc.toTimeZone(zone);
            if (at.isValid() && at.date() == *this)
                return at;
        }
#endif

        when = toEarliest(*this, zone);
    }

    return when;
}